

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<unsigned_short>
               (unsigned_short *src,int sstride,int uw,int vw,unsigned_short *dst,int nchan)

{
  long lVar1;
  int iVar2;
  unsigned_short *puVar3;
  int iVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar1 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar1);
  local_38 = (float)sstride;
  local_34 = vw;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x11ab02;
  memset(__s,0,(long)nchan * 4);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 2;
  iVar2 = (int)local_38 / (int)*(undefined8 *)((long)&uStack_40 + lVar1);
  iVar4 = nchan * uw;
  puVar3 = src + iVar2 * local_34;
  if (nchan < 1) {
    nchan = 0;
  }
  while (src != puVar3) {
    puVar5 = src + iVar4;
    for (; src != puVar5; src = (unsigned_short *)((long)src + uVar6)) {
      for (uVar6 = 0; (uint)(nchan * 2) != uVar6; uVar6 = uVar6 + 2) {
        *(float *)((long)__s + uVar6 * 2) =
             (float)*(ushort *)((long)src + uVar6) + *(float *)((long)__s + uVar6 * 2);
      }
    }
    src = puVar5 + (iVar2 - iVar4);
  }
  for (uVar6 = 0; (uint)nchan != uVar6; uVar6 = uVar6 + 1) {
    dst[uVar6] = (unsigned_short)
                 (int)(*(float *)((long)__s + uVar6 * 4) * (1.0 / (float)(local_34 * uw)));
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }